

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void R_SWRSetWindow(int windowSize,int fullWidth,int fullHeight,int stHeight,int trueratio)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  char local_48 [8];
  char temp [16];
  UCVarValue value;
  int local_28;
  int virtheight2;
  int virtwidth2;
  int virtwidth;
  int virtheight;
  int trueratio_local;
  int stHeight_local;
  int fullHeight_local;
  int fullWidth_local;
  int windowSize_local;
  
  if (!bRenderingToCanvas) {
    mysnprintf(local_48,0x10,"%d x %d",(ulong)(uint)viewwidth,(ulong)(uint)viewheight);
    temp._8_8_ = local_48;
    FBaseCVar::ForceSet(&r_viewsize.super_FBaseCVar,(UCVarValue)temp._8_8_,CVAR_String,false);
  }
  fuzzviewheight = viewheight + -2;
  lastcenteryfrac = 0x40000000;
  CenterX = (double)centerx;
  CenterY = (double)centery;
  bVar2 = Is54Aspect(trueratio);
  if (bVar2) {
    value._4_4_ = (fullHeight * BaseRatioSizes[trueratio][3]) / 0x30;
    local_28 = fullWidth;
  }
  else {
    local_28 = (fullWidth * BaseRatioSizes[trueratio][3]) / 0x30;
    value._4_4_ = fullHeight;
  }
  bVar2 = Is54Aspect(WidescreenRatio);
  if (bVar2) {
    virtwidth2 = (fullHeight * BaseRatioSizes[WidescreenRatio][3]) / 0x30;
    virtheight2 = fullWidth;
  }
  else {
    virtheight2 = (fullWidth * BaseRatioSizes[WidescreenRatio][3]) / 0x30;
    virtwidth2 = fullHeight;
  }
  BaseYaspectMul = ((double)(int)value._4_4_ * 320.0) / ((double)local_28 * 200.0);
  YaspectMul = ((double)virtwidth2 * 320.0) / ((double)virtheight2 * 200.0);
  IYaspectMul = (((double)virtheight2 * 200.0) / 320.0) / (double)virtwidth2;
  InvZtoScale = YaspectMul * CenterX;
  WallTMapScale2 = IYaspectMul / CenterX;
  pspritexscale = (double)centerxwide / 160.0;
  pspriteyscale = pspritexscale * YaspectMul;
  pspritexiscale = 1.0 / pspritexscale;
  clearbufshort(screenheightarray,viewwidth,(WORD)viewheight);
  R_InitTextureMapping();
  dVar5 = InvZtoScale;
  iVar3 = DCanvas::GetWidth((DCanvas *)screen);
  iVar1 = viewwidth;
  iVar4 = DCanvas::GetHeight((DCanvas *)screen);
  MaxVisForWall =
       32767.0 / ((dVar5 * (double)iVar3 * 200.0) / ((double)(iVar1 * iVar4) * FocalTangent));
  MaxVisForFloor = 32767.0 / (((double)viewheight * FocalLengthY) / 160.0);
  dVar5 = R_GetVisibility();
  R_SetVisibility(dVar5);
  return;
}

Assistant:

void R_SWRSetWindow(int windowSize, int fullWidth, int fullHeight, int stHeight, int trueratio)
{
	int virtheight, virtwidth, virtwidth2, virtheight2;

	if (!bRenderingToCanvas)
	{ // Set r_viewsize cvar to reflect the current view size
		UCVarValue value;
		char temp[16];

		mysnprintf (temp, countof(temp), "%d x %d", viewwidth, viewheight);
		value.String = temp;
		r_viewsize.ForceSet (value, CVAR_String);
	}

	fuzzviewheight = viewheight - 2;	// Maximum row the fuzzer can draw to

	lastcenteryfrac = 1<<30;
	CenterX = centerx;
	CenterY = centery;

	virtwidth = virtwidth2 = fullWidth;
	virtheight = virtheight2 = fullHeight;

	if (Is54Aspect(trueratio))
	{
		virtheight2 = virtheight2 * BaseRatioSizes[trueratio][3] / 48;
	}
	else
	{
		virtwidth2 = virtwidth2 * BaseRatioSizes[trueratio][3] / 48;
	}

	if (Is54Aspect(WidescreenRatio))
	{
		virtheight = virtheight * BaseRatioSizes[WidescreenRatio][3] / 48;
	}
	else
	{
		virtwidth = virtwidth * BaseRatioSizes[WidescreenRatio][3] / 48;
	}

	BaseYaspectMul = 320.0 * virtheight2 / (r_Yaspect * virtwidth2);
	YaspectMul = 320.0 * virtheight / (r_Yaspect * virtwidth);
	IYaspectMul = (double)virtwidth * r_Yaspect / 320.0 / virtheight;
	InvZtoScale = YaspectMul * CenterX;

	WallTMapScale2 = IYaspectMul / CenterX;

	// psprite scales
	pspritexscale = centerxwide / 160.0;
	pspriteyscale = pspritexscale * YaspectMul;
	pspritexiscale = 1 / pspritexscale;

	// thing clipping
	clearbufshort (screenheightarray, viewwidth, (short)viewheight);

	R_InitTextureMapping ();

	MaxVisForWall = (InvZtoScale * (SCREENWIDTH*r_Yaspect) /
		(viewwidth*SCREENHEIGHT * FocalTangent));
	MaxVisForWall = 32767.0 / MaxVisForWall;
	MaxVisForFloor = 32767.0 / (viewheight * FocalLengthY / 160);

	// Reset r_*Visibility vars
	R_SetVisibility(R_GetVisibility());
}